

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

Status __thiscall
google::protobuf::anon_unknown_19::ValidateMergedFeatures
          (anon_unknown_19 *this,FeatureSet *features)

{
  bool bVar1;
  FeatureSet_FieldPresence FVar2;
  FeatureSet_EnumType FVar3;
  FeatureSet_RepeatedFieldEncoding FVar4;
  FeatureSet_Utf8Validation FVar5;
  FeatureSet_MessageEncoding FVar6;
  FeatureSet_JsonFormat FVar7;
  FeatureSet *features_local;
  
  FVar2 = FeatureSet::field_presence(features);
  bVar1 = FeatureSet::FieldPresence_IsValid(FVar2);
  if ((bVar1) &&
     (FVar2 = FeatureSet::field_presence(features),
     FVar2 != FeatureSet_FieldPresence_FIELD_PRESENCE_UNKNOWN)) {
    FVar3 = FeatureSet::enum_type(features);
    bVar1 = FeatureSet::EnumType_IsValid(FVar3);
    if ((bVar1) &&
       (FVar3 = FeatureSet::enum_type(features), FVar3 != FeatureSet_EnumType_ENUM_TYPE_UNKNOWN)) {
      FVar4 = FeatureSet::repeated_field_encoding(features);
      bVar1 = FeatureSet::RepeatedFieldEncoding_IsValid(FVar4);
      if ((bVar1) &&
         (FVar4 = FeatureSet::repeated_field_encoding(features),
         FVar4 != FeatureSet_RepeatedFieldEncoding_REPEATED_FIELD_ENCODING_UNKNOWN)) {
        FVar5 = FeatureSet::utf8_validation(features);
        bVar1 = FeatureSet::Utf8Validation_IsValid(FVar5);
        if ((bVar1) &&
           (FVar5 = FeatureSet::utf8_validation(features),
           FVar5 != FeatureSet_Utf8Validation_UTF8_VALIDATION_UNKNOWN)) {
          FVar6 = FeatureSet::message_encoding(features);
          bVar1 = FeatureSet::MessageEncoding_IsValid(FVar6);
          if ((bVar1) &&
             (FVar6 = FeatureSet::message_encoding(features),
             FVar6 != FeatureSet_MessageEncoding_MESSAGE_ENCODING_UNKNOWN)) {
            FVar7 = FeatureSet::json_format(features);
            bVar1 = FeatureSet::JsonFormat_IsValid(FVar7);
            if ((bVar1) &&
               (FVar7 = FeatureSet::json_format(features),
               FVar7 != FeatureSet_JsonFormat_JSON_FORMAT_UNKNOWN)) {
              absl::lts_20240722::OkStatus();
            }
            else {
              (anonymous_namespace)::Error<char_const*>
                        ((_anonymous_namespace_ *)this,
                         "Feature field `json_format` must resolve to a known value, found JSON_FORMAT_UNKNOWN"
                        );
            }
          }
          else {
            (anonymous_namespace)::Error<char_const*>
                      ((_anonymous_namespace_ *)this,
                       "Feature field `message_encoding` must resolve to a known value, found MESSAGE_ENCODING_UNKNOWN"
                      );
          }
        }
        else {
          (anonymous_namespace)::Error<char_const*>
                    ((_anonymous_namespace_ *)this,
                     "Feature field `utf8_validation` must resolve to a known value, found UTF8_VALIDATION_UNKNOWN"
                    );
        }
      }
      else {
        (anonymous_namespace)::Error<char_const*>
                  ((_anonymous_namespace_ *)this,
                   "Feature field `repeated_field_encoding` must resolve to a known value, found REPEATED_FIELD_ENCODING_UNKNOWN"
                  );
      }
    }
    else {
      (anonymous_namespace)::Error<char_const*>
                ((_anonymous_namespace_ *)this,
                 "Feature field `enum_type` must resolve to a known value, found ENUM_TYPE_UNKNOWN")
      ;
    }
  }
  else {
    (anonymous_namespace)::Error<char_const*>
              ((_anonymous_namespace_ *)this,
               "Feature field `field_presence` must resolve to a known value, found FIELD_PRESENCE_UNKNOWN"
              );
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ValidateMergedFeatures(const FeatureSet& features) {
// Avoid using reflection here because this is called early in the descriptor
// builds.  Instead, a reflection-based test will be used to keep this in sync
// with descriptor.proto.  These checks should be run on every global feature
// in FeatureSet.
#define CHECK_ENUM_FEATURE(FIELD, CAMELCASE, UPPERCASE)               \
  if (!FeatureSet::CAMELCASE##_IsValid(features.FIELD()) ||           \
      features.FIELD() == FeatureSet::UPPERCASE##_UNKNOWN) {          \
    return Error("Feature field `" #FIELD                             \
                 "` must resolve to a known value, found " #UPPERCASE \
                 "_UNKNOWN");                                         \
  }

  CHECK_ENUM_FEATURE(field_presence, FieldPresence, FIELD_PRESENCE)
  CHECK_ENUM_FEATURE(enum_type, EnumType, ENUM_TYPE)
  CHECK_ENUM_FEATURE(repeated_field_encoding, RepeatedFieldEncoding,
                     REPEATED_FIELD_ENCODING)
  CHECK_ENUM_FEATURE(utf8_validation, Utf8Validation, UTF8_VALIDATION)
  CHECK_ENUM_FEATURE(message_encoding, MessageEncoding, MESSAGE_ENCODING)
  CHECK_ENUM_FEATURE(json_format, JsonFormat, JSON_FORMAT)

#undef CHECK_ENUM_FEATURE

  return absl::OkStatus();
}